

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O2

void __thiscall nuraft::buffer_serializer::get_buffer(buffer_serializer *this,ptr<buffer> *dst)

{
  size_t sVar1;
  size_t sVar2;
  void *__src;
  byte *__dest;
  
  sVar1 = buffer::size((dst->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  sVar2 = buffer::pos((dst->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  __src = get_raw(this,sVar1 - sVar2);
  __dest = buffer::data((dst->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       );
  memcpy(__dest,__src,sVar1 - sVar2);
  return;
}

Assistant:

void buffer_serializer::get_buffer(ptr<buffer>& dst) {
    size_t len = dst->size() - dst->pos();
    void* ptr = get_raw(len);
    ::memcpy(dst->data(), ptr, len);
}